

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O0

void __thiscall
BamTools::Internal::BamStandardIndex::SaveBinsSummary
          (BamStandardIndex *this,int *refId,int *numBins)

{
  reference pvVar1;
  uint64_t uVar2;
  int *in_RDX;
  size_type in_RDI;
  BaiReferenceSummary *refSummary;
  vector<BamTools::Internal::BaiReferenceSummary,_std::allocator<BamTools::Internal::BaiReferenceSummary>_>
  *in_stack_ffffffffffffffe0;
  
  pvVar1 = std::
           vector<BamTools::Internal::BaiReferenceSummary,_std::allocator<BamTools::Internal::BaiReferenceSummary>_>
           ::at(in_stack_ffffffffffffffe0,in_RDI);
  pvVar1->NumBins = *in_RDX;
  uVar2 = Tell((BamStandardIndex *)0x28f529);
  pvVar1->FirstBinFilePosition = uVar2;
  return;
}

Assistant:

void BamStandardIndex::SaveBinsSummary(const int& refId, const int& numBins)
{
    BaiReferenceSummary& refSummary = m_indexFileSummary.at(refId);
    refSummary.NumBins = numBins;
    refSummary.FirstBinFilePosition = Tell();
}